

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

bool __thiscall capnp::MessageReader::isCanonical(MessageReader *this)

{
  bool bVar1;
  SegmentReader *segment;
  SegmentReader *pSVar2;
  word *readHead;
  word *local_48;
  PointerReader local_40;
  
  if (this->allocatedArena == false) {
    _::ReaderArena::ReaderArena((ReaderArena *)this->arenaSpace,this);
    this->allocatedArena = true;
  }
  bVar1 = false;
  segment = _::ReaderArena::tryGetSegment((ReaderArena *)this->arenaSpace,(SegmentId)0x0);
  if (segment != (SegmentReader *)0x0) {
    pSVar2 = _::ReaderArena::tryGetSegment((ReaderArena *)this->arenaSpace,(SegmentId)0x1);
    if (pSVar2 == (SegmentReader *)0x0) {
      local_48 = (segment->ptr).ptr + 1;
      _::PointerReader::getRoot
                (&local_40,segment,(CapTableReader *)0x0,(segment->ptr).ptr,
                 (this->options).nestingLimit);
      bVar1 = _::PointerReader::isCanonical(&local_40,&local_48);
      bVar1 = (int)((ulong)((long)local_48 - (long)(segment->ptr).ptr) >> 3) ==
              (int)(segment->ptr).size_ && bVar1;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool MessageReader::isCanonical() {
  if (!allocatedArena) {
    static_assert(sizeof(_::ReaderArena) <= sizeof(arenaSpace),
        "arenaSpace is too small to hold a ReaderArena.  Please increase it.  This will break "
        "ABI compatibility.");
    kj::ctor(*arena(), this);
    allocatedArena = true;
  }

  _::SegmentReader *segment = arena()->tryGetSegment(_::SegmentId(0));

  if (segment == NULL) {
    // The message has no segments
    return false;
  }

  if (arena()->tryGetSegment(_::SegmentId(1))) {
    // The message has more than one segment
    return false;
  }

  const word* readHead = segment->getStartPtr() + 1;
  bool rootIsCanonical = _::PointerReader::getRoot(segment, nullptr,
                                                   segment->getStartPtr(),
                                                   this->getOptions().nestingLimit)
                                                  .isCanonical(&readHead);
  bool allWordsConsumed = segment->getOffsetTo(readHead) == segment->getSize();
  return rootIsCanonical && allWordsConsumed;
}